

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void __thiscall Socket::Socket(Socket *this)

{
  SocketError *this_00;
  int iVar1;
  allocator local_39;
  string local_38;
  
  iVar1 = socket(2,1,0);
  this->socketDescriptor = iVar1;
  if (iVar1 != 0) {
    return;
  }
  this_00 = (SocketError *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_38,"Socket error: could not create socket!",&local_39);
  SocketError::SocketError(this_00,&local_38,0);
  __cxa_throw(this_00,&SocketError::typeinfo,SocketError::~SocketError);
}

Assistant:

Socket::Socket()
{
    socketDescriptor = socket(AF_INET, SOCK_STREAM, 0);
    if(socketDescriptor == 0)
    {
        throw SocketError("Socket error: could not create socket!");
    }
}